

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.cpp
# Opt level: O3

size_t qHash(QLatin1StringView key,size_t seed)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  uint64_t uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  array<char16_t,_256UL> buf;
  undefined1 *local_238 [64];
  long local_38;
  
  uVar12 = key.m_size;
  pcVar9 = key.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = uVar12 * 2;
  if (uVar12 < 5) {
    local_238[0] = &DAT_aaaaaaaaaaaaaaaa;
    if (uVar12 != 0) {
      uVar12 = uVar12 + 1;
      lVar3 = 0;
      do {
        *(ushort *)((long)local_238 + lVar3 * 2) = (ushort)(byte)pcVar9[lVar3];
        uVar12 = uVar12 - 1;
        lVar3 = lVar3 + 1;
      } while (1 < uVar12);
    }
    uVar4 = murmurhash(local_238,uVar4,0);
    goto LAB_0016caa8;
  }
  uVar11 = 0x736f6d6570736575;
  uVar5 = 0x6c7967656e657261;
  memset(local_238,0xaa,0x200);
  uVar6 = uVar4 ^ 0x7465646279746573;
  uVar10 = uVar4 ^ 0x646f72616e646f6d;
  if (uVar12 < 0x101) {
    uVar13 = 0;
  }
  else {
    uVar7 = 0x100;
    uVar8 = 0;
    do {
      uVar13 = uVar7;
      qt_from_latin1((char16_t *)local_238,pcVar9 + uVar8,0x100);
      lVar3 = 0;
      do {
        uVar11 = uVar11 + uVar10;
        uVar10 = (uVar10 << 0xd | uVar10 >> 0x33) ^ uVar11;
        uVar6 = uVar6 ^ *(ulong *)((long)local_238 + lVar3);
        uVar7 = (uVar6 << 0x10 | uVar6 >> 0x30) ^ uVar5 + uVar6;
        uVar11 = (uVar11 << 0x20 | uVar11 >> 0x20) + uVar7;
        uVar5 = uVar5 + uVar6 + uVar10;
        uVar10 = (uVar10 << 0x11 | uVar10 >> 0x2f) ^ uVar5;
        uVar5 = uVar5 << 0x20 | uVar5 >> 0x20;
        uVar6 = (uVar7 << 0x15 | uVar7 >> 0x2b) ^ uVar11;
        uVar11 = uVar11 ^ *(ulong *)((long)local_238 + lVar3);
        lVar3 = lVar3 + 8;
      } while (lVar3 != 0x200);
      uVar7 = uVar13 + 0x100;
      uVar8 = uVar13;
    } while (uVar13 + 0x100 < uVar12);
  }
  uVar7 = uVar12 - uVar13;
  if (3 < uVar7) {
    uVar7 = uVar7 & 0xfffffffffffffffc;
    qt_from_latin1((char16_t *)local_238,pcVar9 + uVar13,uVar7);
    if (uVar7 * 2 != 0) {
      lVar3 = 0;
      do {
        uVar11 = uVar11 + uVar10;
        uVar10 = (uVar10 << 0xd | uVar10 >> 0x33) ^ uVar11;
        uVar6 = uVar6 ^ *(ulong *)((long)local_238 + lVar3);
        uVar8 = (uVar6 << 0x10 | uVar6 >> 0x30) ^ uVar5 + uVar6;
        uVar11 = (uVar11 << 0x20 | uVar11 >> 0x20) + uVar8;
        uVar5 = uVar5 + uVar6 + uVar10;
        uVar10 = (uVar10 << 0x11 | uVar10 >> 0x2f) ^ uVar5;
        uVar5 = uVar5 << 0x20 | uVar5 >> 0x20;
        uVar6 = (uVar8 << 0x15 | uVar8 >> 0x2b) ^ uVar11;
        uVar11 = uVar11 ^ *(ulong *)((long)local_238 + lVar3);
        lVar3 = lVar3 + 8;
      } while (uVar7 * 2 != lVar3);
    }
    uVar13 = uVar13 + uVar7;
    uVar7 = uVar12 - uVar13;
  }
  if (0 < (long)uVar7) {
    uVar8 = uVar7 + 1;
    lVar3 = 0;
    do {
      *(ushort *)((long)local_238 + lVar3 * 2) = (ushort)(byte)pcVar9[lVar3 + uVar13];
      uVar8 = uVar8 - 1;
      lVar3 = lVar3 + 1;
    } while (1 < uVar8);
  }
  uVar12 = uVar12 << 0x39;
  uVar7 = uVar7 & 0x7fffffffffffffff;
  if (uVar7 == 1) {
LAB_0016ca11:
    uVar12 = (ulong)local_238[0] & 0xff | uVar12 | ((ulong)local_238[0] >> 8 & 0xff) << 8;
  }
  else {
    if (uVar7 == 2) {
LAB_0016c9f9:
      uVar12 = ((ulong)local_238[0] >> 0x10 & 0xff) << 0x10 |
               ((ulong)local_238[0] >> 0x18 & 0xff) << 0x18 | uVar12;
      goto LAB_0016ca11;
    }
    if (uVar7 == 3) {
      uVar12 = uVar12 | ((ulong)local_238[0] >> 0x20 & 0xffff) << 0x20;
      goto LAB_0016c9f9;
    }
  }
  uVar11 = uVar11 + uVar10;
  uVar13 = (uVar10 << 0xd | uVar10 >> 0x33) ^ uVar11;
  uVar6 = uVar6 ^ uVar12;
  uVar10 = (uVar6 << 0x10 | uVar6 >> 0x30) ^ uVar5 + uVar6;
  uVar7 = (uVar11 << 0x20 | uVar11 >> 0x20) + uVar10;
  uVar5 = uVar5 + uVar6 + uVar13;
  uVar11 = (uVar13 << 0x11 | uVar13 >> 0x2f) ^ uVar5;
  uVar6 = (uVar10 << 0x15 | uVar10 >> 0x2b) ^ uVar7;
  uVar7 = uVar7 ^ uVar12;
  uVar12 = (uVar5 << 0x20 | uVar5 >> 0x20) ^ 0xff;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    uVar7 = uVar7 + uVar11;
    uVar10 = (uVar11 << 0xd | uVar11 >> 0x33) ^ uVar7;
    uVar12 = uVar12 + uVar6;
    uVar5 = (uVar6 << 0x10 | uVar6 >> 0x30) ^ uVar12;
    uVar7 = (uVar7 << 0x20 | uVar7 >> 0x20) + uVar5;
    uVar6 = (uVar5 << 0x15 | uVar5 >> 0x2b) ^ uVar7;
    uVar12 = uVar12 + uVar10;
    uVar11 = (uVar10 << 0x11 | uVar10 >> 0x2f) ^ uVar12;
    uVar12 = uVar12 << 0x20 | uVar12 >> 0x20;
    bVar1 = false;
  } while (bVar2);
  uVar4 = uVar12 ^ uVar6 ^ uVar11 ^ uVar7;
LAB_0016caa8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar4;
}

Assistant:

size_t qHash(QLatin1StringView key, size_t seed) noexcept
{
#ifdef QT_BOOTSTRAPPED
    // the seed is always 0 in bootstrapped mode (no seed generation code),
    // so help the compiler do dead code elimination
    seed = 0;
#endif

    auto data = reinterpret_cast<const uchar *>(key.data());
    size_t size = key.size();

    // Mix in the length as a secondary seed.
    // Multiplied by 2 to match the byte size of the equiavlent UTF-16 string.
    size_t seed2 = size * 2;
    if (seed)
        seed2 = qt_qhash_seed.currentSeed(1);

#if defined(AESHASH)
    if (seed && qCpuHasFeature(AES) && qCpuHasFeature(SSE4_2))
        return aeshash<ByteToWord>(data, size, seed, seed2);
#endif
    return qHashBits_fallback<ByteToWord>(data, size, seed, seed2);
}